

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::prepare_atc_single_color_table(atc_match_entry *pTable,int size0,int size1,int sel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  
  lVar10 = 0;
  uVar11 = 0;
  if (0 < size1) {
    uVar11 = size1;
  }
  uVar1 = 0;
  if (0 < size0) {
    uVar1 = size0;
  }
  do {
    if (lVar10 == 0x100) {
      return;
    }
    iVar9 = 0x100;
    uVar16 = 0;
    while (uVar15 = (uint)uVar16, uVar15 != uVar1) {
      if (size0 == 0x20) {
        uVar5 = uVar15 * 8;
        uVar2 = uVar15 >> 2;
      }
      else if (size0 == 0x10) {
        uVar2 = (uint)(uVar16 >> 3) | uVar15 * 2;
        uVar5 = uVar2 * 8;
        uVar2 = (int)uVar2 >> 2;
      }
      else {
        uVar5 = uVar15 * 4;
        uVar2 = uVar15 >> 4;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar12 = 0;
      uVar8 = 0;
      while (uVar7 = (uint)uVar8, uVar11 != uVar7) {
        if (size1 == 0x20) {
          uVar3 = uVar7 >> 2 | uVar14;
        }
        else if (size1 == 0x10) {
          uVar3 = (uint)(uVar8 >> 3) | uVar12;
          uVar3 = (int)uVar3 >> 2 | uVar3 * 8;
        }
        else {
          uVar3 = uVar7 >> 4 | uVar13;
        }
        if (sel != 3) {
          if (sel != 1) {
            __assert_fail("sel == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x17af,
                          "void basist::prepare_atc_single_color_table(atc_match_entry *, int, int, int)"
                         );
          }
          uVar3 = (int)(uVar3 * 3 + (uVar2 | uVar5) * 5) / 8;
        }
        iVar4 = uVar3 - (int)lVar10;
        iVar6 = -iVar4;
        if (0 < iVar4) {
          iVar6 = iVar4;
        }
        if (iVar6 < iVar9) {
          pTable[lVar10].m_lo = (uint8_t)uVar16;
          pTable[lVar10].m_hi = (uint8_t)uVar8;
          iVar9 = iVar6;
        }
        uVar12 = uVar12 + 2;
        uVar14 = uVar14 + 8;
        uVar13 = uVar13 + 4;
        uVar8 = (ulong)(uVar7 + 1);
      }
      uVar16 = (ulong)(uVar15 + 1);
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

static void prepare_atc_single_color_table(atc_match_entry* pTable, int size0, int size1, int sel)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size0; lo++)
			{
				int lo_e = lo;
				if (size0 == 16)
				{
					lo_e = (lo_e << 1) | (lo_e >> 3);
					lo_e = (lo_e << 3) | (lo_e >> 2);
				}
				else if (size0 == 32)
					lo_e = (lo_e << 3) | (lo_e >> 2);
				else
					lo_e = (lo_e << 2) | (lo_e >> 4);

				for (int hi = 0; hi < size1; hi++)
				{
					int hi_e = hi;
					if (size1 == 16)
					{
						// This is only for PVRTC2 - expand to 5 then 8
						hi_e = (hi_e << 1) | (hi_e >> 3);
						hi_e = (hi_e << 3) | (hi_e >> 2);
					}
					else if (size1 == 32)
						hi_e = (hi_e << 3) | (hi_e >> 2);
					else
						hi_e = (hi_e << 2) | (hi_e >> 4);

					int e;

					if (sel == 1)
					{
						// Selector 1
						e = abs(((lo_e * 5 + hi_e * 3) / 8) - i);
					}
					else
					{
						assert(sel == 3);

						// Selector 3
						e = abs(hi_e - i);
					}

					if (e < lowest_e)
					{
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						pTable[i].m_hi = static_cast<uint8_t>(hi);

						lowest_e = e;
					}

				} // hi
			} // lo
		} // i
	}